

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * parse_object(cJSON *item,char *value)

{
  char *pcVar1;
  cJSON *pcVar2;
  cJSON *item_00;
  char *pcVar3;
  bool bVar4;
  
  pcVar1 = value;
  if (*value == '{') {
    item->type = 6;
    pcVar1 = value + 1;
    do {
      pcVar3 = pcVar1;
      pcVar1 = pcVar3 + 1;
    } while ((byte)(*pcVar3 - 1U) < 0x20);
    if (*pcVar3 == '}') {
      return pcVar3 + 1;
    }
    pcVar2 = (cJSON *)(*cJSON_malloc)(0x40);
    if (pcVar2 == (cJSON *)0x0) {
      item->child = (cJSON *)0x0;
      pcVar1 = ep;
    }
    else {
      pcVar3 = pcVar3 + -1;
      pcVar2->valuedouble = 0.0;
      pcVar2->string = (char *)0x0;
      pcVar2->valuestring = (char *)0x0;
      *(undefined8 *)&pcVar2->valueint = 0;
      pcVar2->child = (cJSON *)0x0;
      *(undefined8 *)&pcVar2->type = 0;
      pcVar2->next = (cJSON *)0x0;
      pcVar2->prev = (cJSON *)0x0;
      item->child = pcVar2;
      do {
        pcVar1 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
      } while ((byte)(*pcVar1 - 1U) < 0x20);
      pcVar3 = parse_string(pcVar2,pcVar3);
      if (pcVar3 != (char *)0x0) {
        pcVar3 = pcVar3 + -1;
        do {
          pcVar1 = pcVar3 + 1;
          pcVar3 = pcVar3 + 1;
        } while ((byte)(*pcVar1 - 1U) < 0x20);
      }
      pcVar1 = ep;
      if (pcVar3 != (char *)0x0) {
        pcVar2->string = pcVar2->valuestring;
        pcVar2->valuestring = (char *)0x0;
        pcVar1 = pcVar3;
        if (*pcVar3 == ':') {
          do {
            pcVar1 = pcVar3 + 1;
            pcVar3 = pcVar3 + 1;
          } while ((byte)(*pcVar1 - 1U) < 0x20);
          pcVar3 = parse_value(pcVar2,pcVar3);
          if (pcVar3 != (char *)0x0) {
            pcVar3 = pcVar3 + -1;
            do {
              pcVar1 = pcVar3 + 1;
              pcVar3 = pcVar3 + 1;
            } while ((byte)(*pcVar1 - 1U) < 0x20);
          }
          pcVar1 = ep;
          if (pcVar3 != (char *)0x0) {
            while (*pcVar3 == ',') {
              item_00 = (cJSON *)(*cJSON_malloc)(0x40);
              if (item_00 == (cJSON *)0x0) {
                bVar4 = false;
              }
              else {
                item_00->valuedouble = 0.0;
                item_00->string = (char *)0x0;
                item_00->valuestring = (char *)0x0;
                *(undefined8 *)&item_00->valueint = 0;
                item_00->child = (cJSON *)0x0;
                *(undefined8 *)&item_00->type = 0;
                item_00->next = (cJSON *)0x0;
                item_00->prev = (cJSON *)0x0;
                pcVar2->next = item_00;
                item_00->prev = pcVar2;
                do {
                  pcVar1 = pcVar3 + 1;
                  pcVar3 = pcVar3 + 1;
                } while ((byte)(*pcVar1 - 1U) < 0x20);
                pcVar3 = parse_string(item_00,pcVar3);
                if (pcVar3 != (char *)0x0) {
                  pcVar3 = pcVar3 + -1;
                  do {
                    pcVar1 = pcVar3 + 1;
                    pcVar3 = pcVar3 + 1;
                  } while ((byte)(*pcVar1 - 1U) < 0x20);
                }
                pcVar2 = item_00;
                if (pcVar3 == (char *)0x0) {
                  pcVar3 = (char *)0x0;
                  pcVar1 = ep;
                }
                else {
                  item_00->string = item_00->valuestring;
                  item_00->valuestring = (char *)0x0;
                  pcVar1 = pcVar3;
                  if (*pcVar3 == ':') {
                    do {
                      pcVar1 = pcVar3 + 1;
                      pcVar3 = pcVar3 + 1;
                    } while ((byte)(*pcVar1 - 1U) < 0x20);
                    pcVar3 = parse_value(item_00,pcVar3);
                    if (pcVar3 != (char *)0x0) {
                      pcVar3 = pcVar3 + -1;
                      do {
                        pcVar1 = pcVar3 + 1;
                        pcVar3 = pcVar3 + 1;
                      } while ((byte)(*pcVar1 - 1U) < 0x20);
                    }
                    bVar4 = pcVar3 != (char *)0x0;
                    goto LAB_0016ef5d;
                  }
                }
                ep = pcVar1;
                bVar4 = false;
              }
LAB_0016ef5d:
              if (!bVar4) {
                return (char *)0x0;
              }
            }
            pcVar1 = pcVar3;
            if (*pcVar3 == '}') {
              return pcVar3 + 1;
            }
          }
        }
      }
    }
  }
  ep = pcVar1;
  return (char *)0x0;
}

Assistant:

static const char *
parse_object(cJSON *item, const char *value)
{
    cJSON *child;
    if (*value != '{') {
        ep = value;
        return 0;
    } /* not an object! */

    item->type = cJSON_Object;
    value = skip(value + 1);
    if (*value == '}')
        return value + 1; /* empty array. */

    item->child = child = cJSON_New_Item();
    if (!item->child)
        return 0;
    value = skip(parse_string(child, skip(value)));
    if (!value)
        return 0;
    child->string = child->valuestring;
    child->valuestring = 0;
    if (*value != ':') {
        ep = value;
        return 0;
    }                                                  /* fail! */
    value = skip(parse_value(child, skip(value + 1))); /* skip any spacing, get the value. */
    if (!value)
        return 0;

    while (*value == ',') {
        cJSON *new_item;
        if (!(new_item = cJSON_New_Item()))
            return 0; /* memory fail */
        child->next = new_item;
        new_item->prev = child;
        child = new_item;
        value = skip(parse_string(child, skip(value + 1)));
        if (!value)
            return 0;
        child->string = child->valuestring;
        child->valuestring = 0;
        if (*value != ':') {
            ep = value;
            return 0;
        }                                                  /* fail! */
        value = skip(parse_value(child, skip(value + 1))); /* skip any spacing, get the value. */
        if (!value)
            return 0;
    }

    if (*value == '}')
        return value + 1; /* end of array */
    ep = value;
    return 0; /* malformed. */
}